

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwGetFramebufferSize(GLFWwindow *handle,int *width,int *height)

{
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  _GLFWwindow *in_RDI;
  _GLFWwindow *window;
  int *in_stack_ffffffffffffffd8;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    _glfwPlatformGetFramebufferSize(in_RDI,in_stack_ffffffffffffffd8,(int *)0x4a0705);
  }
  return;
}

Assistant:

GLFWAPI void glfwGetFramebufferSize(GLFWwindow* handle, int* width, int* height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetFramebufferSize(window, width, height);
}